

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b_tree_node.cpp
# Opt level: O0

void __thiscall b_tree_node::b_tree_node(b_tree_node *this,pager *p,int64_t ofs)

{
  ushort uVar1;
  runtime_error *this_00;
  uint16_t *puVar2;
  int64_t *piVar3;
  pair<unsigned_char_*,_unsigned_char_*> pVar4;
  uchar *read_ptr;
  int64_t ofs_local;
  pager *p_local;
  b_tree_node *this_local;
  
  this->_p = p;
  this->_ofs_field = ofs;
  pager::map_page_from(&this->_mm,this->_p,this->_ofs_field);
  if (ofs == 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Unable to create b_tree_node from offset 0");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pVar4 = r_memory_map::map(&this->_mm);
  puVar2 = (uint16_t *)pVar4.first;
  this->_min_degree_field = puVar2;
  this->_leaf_field = puVar2 + 1;
  this->_num_keys_field = puVar2 + 2;
  puVar2 = puVar2 + 3;
  this->_keys_field = (int64_t *)puVar2;
  uVar1 = *this->_min_degree_field;
  this->_valid_keys_field = (uint8_t *)(puVar2 + (long)(int)((uint)uVar1 * 2 + -1) * 4);
  piVar3 = (int64_t *)
           ((long)(int)((uint)*this->_min_degree_field * 2 + -1) +
           (long)(puVar2 + (long)(int)((uint)uVar1 * 2 + -1) * 4));
  this->_vals_field = piVar3;
  this->_child_ofs_field = piVar3 + (int)((uint)*this->_min_degree_field * 2 + -1);
  return;
}

Assistant:

b_tree_node::b_tree_node(const pager& p, int64_t ofs) :
    _p(p),
    _ofs_field(ofs),
    _mm(_p.map_page_from(_ofs_field))
{
    if(ofs == 0)
        throw runtime_error("Unable to create b_tree_node from offset 0");

    auto read_ptr = _mm.map().first;

    _min_degree_field = (uint16_t*)read_ptr;
    read_ptr += sizeof(uint16_t);

    _leaf_field = (uint16_t*)read_ptr;
    read_ptr += sizeof(uint16_t);

    _num_keys_field = (uint16_t*)read_ptr;
    read_ptr += sizeof(uint16_t);

    _keys_field = (int64_t*)read_ptr;
    read_ptr += sizeof(int64_t) * ((*_min_degree_field * 2) - 1);

    _valid_keys_field = (uint8_t*)read_ptr;
    read_ptr += sizeof(uint8_t) * ((*_min_degree_field * 2) - 1);

    _vals_field = (int64_t*)read_ptr;
    read_ptr += sizeof(int64_t) * ((*_min_degree_field * 2) - 1);

    _child_ofs_field = (int64_t*)read_ptr;
}